

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O1

void SSL_CTX_flush_sessions(SSL_CTX *ctx,long tm)

{
  TIMEOUT_PARAM tp;
  SSL_CTX *local_38;
  long local_30;
  _LHASH *local_28;
  code *local_20;
  undefined1 *local_18;
  
  local_28 = *(_LHASH **)&(ctx->stats).sess_connect_good;
  if (local_28 != (_LHASH *)0x0) {
    local_38 = ctx;
    local_30 = tm;
    CRYPTO_MUTEX_lock_write((CRYPTO_MUTEX *)&ctx->cert_store);
    local_20 = timeout_doall_arg;
    local_18 = (undefined1 *)&local_38;
    OPENSSL_lh_doall_arg(local_28,lh_SSL_SESSION_call_doall_arg,&local_20);
    CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)&ctx->cert_store);
  }
  return;
}

Assistant:

void SSL_CTX_flush_sessions(SSL_CTX *ctx, uint64_t time) {
  TIMEOUT_PARAM tp;

  tp.ctx = ctx;
  tp.cache = ctx->sessions;
  if (tp.cache == NULL) {
    return;
  }
  tp.time = time;
  MutexWriteLock lock(&ctx->lock);
  lh_SSL_SESSION_doall_arg(tp.cache, timeout_doall_arg, &tp);
}